

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O3

basic_string<char> * __thiscall
frozen::bits::LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>>::
doitfirst<frozen::basic_string<char>const*,32ul>
          (LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>> *this,
          long first)

{
  long lVar1;
  char cVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  basic_string<char> *it;
  basic_string<char> *pbVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  plVar3 = *(long **)this;
  uVar4 = *(ulong *)(first + 0xf8);
  uVar5 = plVar3[1];
  uVar11 = uVar5;
  if (uVar4 < uVar5) {
    uVar11 = uVar4;
  }
  if (uVar11 != 0) {
    uVar9 = 0;
    uVar13 = 1;
    do {
      cVar2 = *(char *)(*(long *)(first + 0xf0) + uVar9);
      if (cVar2 < *(char *)(*plVar3 + uVar9)) goto LAB_00187507;
      if (*(char *)(*plVar3 + uVar9) < cVar2) goto LAB_00187515;
      bVar6 = uVar13 < uVar11;
      uVar9 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar6);
  }
  if (uVar4 < uVar5) {
LAB_00187507:
    pbVar7 = doitfirst<frozen::basic_string<char>const*,16ul>(this,first + 0x100);
    return pbVar7;
  }
LAB_00187515:
  uVar4 = *(ulong *)(first + 0x78);
  uVar11 = uVar5;
  if (uVar4 < uVar5) {
    uVar11 = uVar4;
  }
  if (uVar11 != 0) {
    lVar10 = 0;
    uVar9 = 0;
    uVar13 = 1;
    do {
      cVar2 = *(char *)(*(long *)(first + 0x70) + uVar9);
      if (cVar2 < *(char *)(*plVar3 + uVar9)) goto LAB_00187555;
      if (*(char *)(*plVar3 + uVar9) < cVar2) goto LAB_0018755e;
      bVar6 = uVar13 < uVar11;
      uVar9 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar6);
  }
  if (uVar4 < uVar5) {
LAB_00187555:
    lVar10 = 0x80;
  }
  else {
    lVar10 = 0;
  }
LAB_0018755e:
  lVar8 = first + lVar10;
  uVar4 = *(ulong *)(first + 0x38 + lVar10);
  uVar11 = uVar5;
  if (uVar4 < uVar5) {
    uVar11 = uVar4;
  }
  if (uVar11 != 0) {
    lVar10 = 0;
    uVar9 = 0;
    uVar13 = 1;
    do {
      cVar2 = *(char *)(*(long *)(lVar8 + 0x30) + uVar9);
      if (cVar2 < *(char *)(*plVar3 + uVar9)) goto LAB_001875a3;
      if (*(char *)(*plVar3 + uVar9) < cVar2) goto LAB_001875ac;
      bVar6 = uVar13 < uVar11;
      uVar9 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar6);
  }
  if (uVar4 < uVar5) {
LAB_001875a3:
    lVar10 = 0x40;
  }
  else {
    lVar10 = 0;
  }
LAB_001875ac:
  lVar1 = lVar8 + lVar10;
  uVar4 = *(ulong *)(lVar8 + 0x18 + lVar10);
  uVar11 = uVar5;
  if (uVar4 < uVar5) {
    uVar11 = uVar4;
  }
  if (uVar11 != 0) {
    lVar10 = 0;
    uVar9 = 0;
    uVar13 = 1;
    do {
      cVar2 = *(char *)(*(long *)(lVar1 + 0x10) + uVar9);
      if (cVar2 < *(char *)(*plVar3 + uVar9)) goto LAB_001875f1;
      if (*(char *)(*plVar3 + uVar9) < cVar2) goto LAB_001875fa;
      bVar6 = uVar13 < uVar11;
      uVar9 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar6);
  }
  if (uVar4 < uVar5) {
LAB_001875f1:
    lVar10 = 0x20;
  }
  else {
    lVar10 = 0;
  }
LAB_001875fa:
  uVar4 = *(ulong *)(lVar1 + 8 + lVar10);
  uVar11 = uVar5;
  if (uVar4 < uVar5) {
    uVar11 = uVar4;
  }
  if (uVar11 != 0) {
    uVar12 = 1;
    lVar8 = 0;
    uVar9 = 0;
    do {
      cVar2 = *(char *)(*(long *)(lVar1 + lVar10) + uVar9);
      if (cVar2 < *(char *)(*plVar3 + uVar9)) goto LAB_0018763f;
      if (*(char *)(*plVar3 + uVar9) < cVar2) goto LAB_00187648;
      uVar9 = (ulong)uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar9 < uVar11);
  }
  if (uVar4 < uVar5) {
LAB_0018763f:
    lVar8 = 0x10;
  }
  else {
    lVar8 = 0;
  }
LAB_00187648:
  return (basic_string<char> *)(lVar1 + lVar10 + lVar8);
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }